

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimatedLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  int iVar1;
  int iVar2;
  ParseLocation *this_00;
  reference pvVar3;
  runtime_error *this_01;
  _func_int **pp_Var4;
  undefined8 *in_RDX;
  Node *in_RDI;
  Ref<embree::XML> *in_stack_00000058;
  XMLLoader *in_stack_00000060;
  Vec2f time_range;
  size_t i_1;
  LightType light_type;
  size_t i;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  lights;
  size_t numLights;
  char *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  allocator_type *in_stack_fffffffffffffd70;
  allocator *lights_00;
  size_type in_stack_fffffffffffffd78;
  AnimatedLightNode *this_02;
  BBox1f in_stack_fffffffffffffd80;
  long *local_210;
  undefined4 local_1c4;
  string *in_stack_fffffffffffffe40;
  XML *in_stack_fffffffffffffe48;
  undefined4 local_194;
  undefined1 local_190 [7];
  undefined1 local_189;
  string local_168 [32];
  ParseLocation *local_148;
  int local_13c;
  long *local_138;
  long *local_130;
  long *local_128;
  ParseLocation *local_120;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  local_100;
  ParseLocation *local_e8;
  undefined8 *local_e0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  long **local_a8;
  undefined8 local_98;
  _func_int **local_88;
  long **local_78;
  long **local_68;
  long **local_60;
  long **local_58;
  reference local_50;
  long **local_48;
  reference local_38;
  reference local_30;
  undefined1 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  long *local_10;
  long **local_8;
  
  local_e0 = in_RDX;
  this_00 = (ParseLocation *)XML::size((XML *)0x3c35a2);
  local_e8 = this_00;
  if (this_00 == (ParseLocation *)0x0) {
    local_98 = 0;
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
  }
  else {
    std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>::allocator
              ((allocator<embree::Ref<embree::SceneGraph::LightNode>_> *)0x3c362d);
    std::
    vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
    ::vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
              *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>::~allocator
              ((allocator<embree::Ref<embree::SceneGraph::LightNode>_> *)0x3c3659);
    for (local_120 = (ParseLocation *)0x0; local_120 < local_e8;
        local_120 = (ParseLocation *)
                    ((long)&(local_120->fileName).
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 1)) {
      local_b8 = local_e0;
      XML::child(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
      loadLight(in_stack_00000060,in_stack_00000058);
      local_60 = &local_128;
      local_68 = &local_130;
      if (local_130 == (long *)0x0) {
        local_210 = (long *)0x0;
      }
      else {
        local_210 = (long *)__dynamic_cast(local_130,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::LightNode::typeinfo,0);
      }
      local_8 = &local_128;
      local_10 = local_210;
      local_128 = local_210;
      if (local_210 != (long *)0x0) {
        (**(code **)(*local_210 + 0x10))();
      }
      pvVar3 = std::
               vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
               ::operator[](&local_100,(size_type)local_120);
      local_58 = &local_128;
      local_50 = pvVar3;
      if (pvVar3->ptr != (LightNode *)0x0) {
        (*(pvVar3->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pvVar3->ptr = (LightNode *)*local_58;
      *local_58 = (long *)0x0;
      local_48 = &local_128;
      if (local_128 != (long *)0x0) {
        (**(code **)(*local_128 + 0x18))();
      }
      local_78 = &local_130;
      if (local_130 != (long *)0x0) {
        (**(code **)(*local_130 + 0x18))();
      }
      local_a8 = &local_138;
      if (local_138 != (long *)0x0) {
        (**(code **)(*local_138 + 0x18))();
      }
    }
    local_30 = std::
               vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
               ::operator[](&local_100,0);
    local_13c = (*(local_30->ptr->super_Node).super_RefCount._vptr_RefCount[0xf])();
    for (local_148 = (ParseLocation *)0x1; iVar1 = local_13c, local_148 < local_e8;
        local_148 = (ParseLocation *)
                    ((long)&(local_148->fileName).
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 1)) {
      local_38 = std::
                 vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                 ::operator[](&local_100,(size_type)local_148);
      iVar2 = (*(local_38->ptr->super_Node).super_RefCount._vptr_RefCount[0xf])();
      if (iVar1 != iVar2) {
        local_189 = 1;
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_c0 = local_e0;
        ParseLocation::str_abi_cxx11_(this_00);
        std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        std::runtime_error::runtime_error(this_01,local_168);
        local_189 = 0;
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_c8 = local_e0;
    this_02 = (AnimatedLightNode *)*local_e0;
    lights_00 = (allocator *)&stack0xfffffffffffffe47;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe48,"time_range",lights_00);
    XML::parm_Vec2f(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe47);
    pp_Var4 = (_func_int **)::operator_new(0x88);
    local_20 = &local_194;
    local_28 = local_190;
    local_18 = &local_1c4;
    local_1c4 = local_194;
    SceneGraph::AnimatedLightNode::AnimatedLightNode
              (this_02,(vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                        *)lights_00,in_stack_fffffffffffffd80);
    (in_RDI->super_RefCount)._vptr_RefCount = pp_Var4;
    local_88 = pp_Var4;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    std::
    vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
    ::~vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
               *)lights_00);
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimatedLight(const Ref<XML>& xml) 
  {
    size_t numLights = xml->size();
    if (numLights == 0)
      return nullptr;

    /* load list of lights */
    std::vector<Ref<SceneGraph::LightNode>> lights(numLights);
    for (size_t i=0; i<numLights; i++) 
      lights[i] = loadLight(xml->child(i)).dynamicCast<SceneGraph::LightNode>();

    /* check that all lights are of same type */
    auto light_type = lights[0]->getType();
    for (size_t i=1; i<numLights; i++) {
      if (light_type != lights[i]->getType())
        THROW_RUNTIME_ERROR(xml->loc.str()+": light types do not match");
    }

    const Vec2f time_range = xml->parm_Vec2f("time_range");
    return new SceneGraph::AnimatedLightNode(std::move(lights),BBox1f(time_range.x,time_range.y));
  }